

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void loop(void)

{
  char *pcVar1;
  Position PVar2;
  int me;
  int x;
  int y;
  int z;
  char tmp [10000];
  int local_2754;
  int local_2750;
  char local_274c [4];
  undefined1 local_2748 [10008];
  
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              memset(buffer,0,10000);
              fgets(buffer,10000,_stdin);
              pcVar1 = strstr(buffer,"START");
              if (pcVar1 == (char *)0x0) break;
              memset(board,0,0xe1);
            }
            pcVar1 = strstr(buffer,"PLACE");
            if (pcVar1 == (char *)0x0) break;
            memset(local_2748,0,10000);
            __isoc99_sscanf(buffer,"%s %d %d %d",local_2748,&local_2754,&local_2750,local_274c);
            board[local_2754][local_2750] = local_274c[0];
          }
          pcVar1 = strstr(buffer,"DONE");
          if (pcVar1 == (char *)0x0) break;
          done();
        }
        me = 0x102032;
        pcVar1 = strstr(buffer,"BEGIN");
        if (pcVar1 == (char *)0x0) break;
        PVar2 = aiBegin(board,me);
        board[PVar2.x][(long)PVar2 >> 0x20] = '\x01';
        printf("%d %d\n",(long)PVar2.x,(ulong)PVar2 >> 0x20);
        fflush(_stdout);
      }
      pcVar1 = strstr(buffer,"TURN");
      if (pcVar1 == (char *)0x0) break;
      memset(local_2748,0,10000);
      __isoc99_sscanf(buffer,"%s %d %d",local_2748,&local_2754,&local_2750);
      turn(local_2754,local_2750);
    }
    pcVar1 = strstr(buffer,"END");
  } while (pcVar1 == (char *)0x0);
  memset(local_2748,0,10000);
  __isoc99_sscanf(buffer,"%s %d",local_2748,&local_2754);
  return;
}

Assistant:

void loop() {
    while (TRUE) {
        memset(buffer, 0, sizeof(buffer));
        fgets(buffer, MAX_BYTE, stdin);

        if (strstr(buffer, START)) {
            start();
        } else if (strstr(buffer, PLACE)) {
            char tmp[MAX_BYTE] = {0};
            int x, y, z;
            sscanf(buffer, "%s %d %d %d", tmp, &x, &y, &z);
            place(x, y, (char) z);
        } else if (strstr(buffer, DONE)) {
            done();
        } else if (strstr(buffer, BEGIN)) {
            // AI
            struct Position pos = aiBegin((const char (*)[BOARD_SIZE]) board, ME);
            board[pos.x][pos.y] = ME;
            printf("%d %d\n", pos.x, pos.y);
            fflush(stdout);
        } else if (strstr(buffer, TURN)) {
            char tmp[MAX_BYTE] = {0};
            int x, y;
            sscanf(buffer, "%s %d %d", tmp, &x, &y);
            turn(x, y);
        } else if (strstr(buffer, END)) {
            char tmp[MAX_BYTE] = {0};
            int x;
            sscanf(buffer, "%s %d", tmp, &x);
            end(x);
            break;
        }
    }
}